

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O1

void __thiscall cmTarget::AppendProperty(cmTarget *this,string *prop,char *value,bool asString)

{
  pointer *pppTVar1;
  cmMakefile *pcVar2;
  iterator iVar3;
  cmTargetInternals *pcVar4;
  cmGeneratorExpression cVar5;
  _Alloc_hider _Var6;
  bool bVar7;
  int iVar8;
  cmCompiledGeneratorExpression *x_1;
  ostream *poVar9;
  TargetPropertyEntry *pTVar10;
  auto_ptr<cmCompiledGeneratorExpression> *this_00;
  cmGeneratorExpression *this_01;
  vector<cmListFileContext,_std::allocator<cmListFileContext>_> *this_02;
  cmGeneratorExpression ge;
  auto_ptr<cmCompiledGeneratorExpression> cge;
  ostringstream e;
  cmGeneratorExpression local_218;
  undefined1 local_210 [16];
  undefined1 local_200 [32];
  string local_1e0;
  auto_ptr<cmCompiledGeneratorExpression> local_1c0;
  auto_ptr<cmCompiledGeneratorExpression> local_1b8;
  auto_ptr<cmCompiledGeneratorExpression> local_1b0;
  auto_ptr<cmCompiledGeneratorExpression> local_1a8;
  auto_ptr<cmCompiledGeneratorExpression> local_1a0;
  undefined1 local_198 [376];
  
  this_01 = &local_218;
  if ((this->TargetTypeValue == INTERFACE_LIBRARY) &&
     (bVar7 = whiteListedInterfaceProperty(prop), !bVar7)) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,
               "INTERFACE_LIBRARY targets may only have whitelisted properties.  The property \"",
               0x4f);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)local_198,(prop->_M_dataplus)._M_p,prop->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" is not allowed.",0x11);
    pcVar2 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_210);
LAB_0030a503:
    if ((cmListFileBacktrace *)local_210._0_8_ != (cmListFileBacktrace *)local_200) {
      operator_delete((void *)local_210._0_8_,local_200._0_8_ + 1);
    }
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_198);
    std::ios_base::~ios_base((ios_base *)(local_198 + 0x70));
    return;
  }
  iVar8 = std::__cxx11::string::compare((char *)prop);
  if (iVar8 == 0) {
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)local_198,"NAME property is read-only\n",0x1b);
    pcVar2 = this->Makefile;
    std::__cxx11::stringbuf::str();
    cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_210);
    goto LAB_0030a503;
  }
  iVar8 = std::__cxx11::string::compare((char *)prop);
  if (iVar8 == 0) {
    cmMakefile::GetBacktrace((cmListFileBacktrace *)local_198,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_210,(cmListFileBacktrace *)local_198);
    pcVar4 = (this->Internal).Pointer;
    pTVar10 = (TargetPropertyEntry *)operator_new(0x10);
    cmGeneratorExpression::Parse(&local_218,local_210);
    cVar5.Backtrace = local_218.Backtrace;
    local_218.Backtrace = (cmListFileBacktrace *)0x0;
    local_1a0.x_ = (cmCompiledGeneratorExpression *)0x0;
    (pTVar10->ge).x_ = (cmCompiledGeneratorExpression *)cVar5.Backtrace;
    pTVar10->LinkImplItem = &cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
    iVar3._M_current =
         (pcVar4->IncludeDirectoriesEntries).
         super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    local_1e0._M_dataplus._M_p = (pointer)pTVar10;
    if (iVar3._M_current ==
        (pcVar4->IncludeDirectoriesEntries).
        super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
      ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                  *)&pcVar4->IncludeDirectoriesEntries,iVar3,
                 (TargetPropertyEntry **)(local_200 + 0x20));
    }
    else {
      *iVar3._M_current = pTVar10;
      pppTVar1 = &(pcVar4->IncludeDirectoriesEntries).
                  super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      *pppTVar1 = *pppTVar1 + 1;
    }
    this_00 = &local_1a0;
LAB_0030a8c7:
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(this_00);
  }
  else {
    iVar8 = std::__cxx11::string::compare((char *)prop);
    if (iVar8 == 0) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_198,this->Makefile);
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_210,(cmListFileBacktrace *)local_198);
      pcVar4 = (this->Internal).Pointer;
      pTVar10 = (TargetPropertyEntry *)operator_new(0x10);
      cmGeneratorExpression::Parse(&local_218,local_210);
      cVar5.Backtrace = local_218.Backtrace;
      local_218.Backtrace = (cmListFileBacktrace *)0x0;
      local_1a8.x_ = (cmCompiledGeneratorExpression *)0x0;
      (pTVar10->ge).x_ = (cmCompiledGeneratorExpression *)cVar5.Backtrace;
      pTVar10->LinkImplItem = &cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
      iVar3._M_current =
           (pcVar4->CompileOptionsEntries).
           super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1e0._M_dataplus._M_p = (pointer)pTVar10;
      if (iVar3._M_current ==
          (pcVar4->CompileOptionsEntries).
          super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
        ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                  ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                    *)&pcVar4->CompileOptionsEntries,iVar3,
                   (TargetPropertyEntry **)(local_200 + 0x20));
      }
      else {
        *iVar3._M_current = pTVar10;
        pppTVar1 = &(pcVar4->CompileOptionsEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      this_00 = &local_1a8;
      goto LAB_0030a8c7;
    }
    iVar8 = std::__cxx11::string::compare((char *)prop);
    if (iVar8 == 0) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_198,this->Makefile);
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_210,(cmListFileBacktrace *)local_198);
      pcVar4 = (this->Internal).Pointer;
      pTVar10 = (TargetPropertyEntry *)operator_new(0x10);
      cmGeneratorExpression::Parse(&local_218,local_210);
      cVar5.Backtrace = local_218.Backtrace;
      local_218.Backtrace = (cmListFileBacktrace *)0x0;
      local_1b0.x_ = (cmCompiledGeneratorExpression *)0x0;
      (pTVar10->ge).x_ = (cmCompiledGeneratorExpression *)cVar5.Backtrace;
      pTVar10->LinkImplItem = &cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
      iVar3._M_current =
           (pcVar4->CompileFeaturesEntries).
           super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1e0._M_dataplus._M_p = (pointer)pTVar10;
      if (iVar3._M_current ==
          (pcVar4->CompileFeaturesEntries).
          super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
        ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                  ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                    *)&pcVar4->CompileFeaturesEntries,iVar3,
                   (TargetPropertyEntry **)(local_200 + 0x20));
      }
      else {
        *iVar3._M_current = pTVar10;
        pppTVar1 = &(pcVar4->CompileFeaturesEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      this_00 = &local_1b0;
      goto LAB_0030a8c7;
    }
    iVar8 = std::__cxx11::string::compare((char *)prop);
    if (iVar8 == 0) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_198,this->Makefile);
      cmGeneratorExpression::cmGeneratorExpression
                ((cmGeneratorExpression *)local_210,(cmListFileBacktrace *)local_198);
      pcVar4 = (this->Internal).Pointer;
      pTVar10 = (TargetPropertyEntry *)operator_new(0x10);
      cmGeneratorExpression::Parse(&local_218,local_210);
      cVar5.Backtrace = local_218.Backtrace;
      local_218.Backtrace = (cmListFileBacktrace *)0x0;
      local_1b8.x_ = (cmCompiledGeneratorExpression *)0x0;
      (pTVar10->ge).x_ = (cmCompiledGeneratorExpression *)cVar5.Backtrace;
      pTVar10->LinkImplItem = &cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
      iVar3._M_current =
           (pcVar4->CompileDefinitionsEntries).
           super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
           ._M_impl.super__Vector_impl_data._M_finish;
      local_1e0._M_dataplus._M_p = (pointer)pTVar10;
      if (iVar3._M_current ==
          (pcVar4->CompileDefinitionsEntries).
          super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::
        vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
        ::_M_realloc_insert<cmTargetInternals::TargetPropertyEntry*>
                  ((vector<cmTargetInternals::TargetPropertyEntry*,std::allocator<cmTargetInternals::TargetPropertyEntry*>>
                    *)&pcVar4->CompileDefinitionsEntries,iVar3,
                   (TargetPropertyEntry **)(local_200 + 0x20));
      }
      else {
        *iVar3._M_current = pTVar10;
        pppTVar1 = &(pcVar4->CompileDefinitionsEntries).
                    super__Vector_base<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
        *pppTVar1 = *pppTVar1 + 1;
      }
      this_00 = &local_1b8;
      goto LAB_0030a8c7;
    }
    iVar8 = std::__cxx11::string::compare((char *)prop);
    if ((iVar8 == 0) && (this->IsImportedTarget == true)) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"EXPORT_NAME property can\'t be set on imported targets (\"",
                 0x38);
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\")\n",3);
      pcVar2 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_210);
      goto LAB_0030a503;
    }
    iVar8 = std::__cxx11::string::compare((char *)prop);
    if (iVar8 == 0) {
      cmMakefile::GetBacktrace((cmListFileBacktrace *)local_210,this->Makefile);
      std::__cxx11::string::string((string *)(local_200 + 0x20),value,(allocator *)&local_218);
      cmValueWithOrigin::cmValueWithOrigin
                ((cmValueWithOrigin *)local_198,(string *)(local_200 + 0x20),
                 (cmListFileBacktrace *)local_210);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      std::vector<cmValueWithOrigin,_std::allocator<cmValueWithOrigin>_>::push_back
                (&((this->Internal).Pointer)->LinkImplementationPropertyEntries,
                 (value_type *)local_198);
      cmValueWithOrigin::~cmValueWithOrigin((cmValueWithOrigin *)local_198);
      this_02 = (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_210;
      goto LAB_0030a8e6;
    }
    iVar8 = std::__cxx11::string::compare((char *)prop);
    if (iVar8 != 0) {
      cmPropertyMap::AppendProperty(&this->Properties,prop,value,asString);
      MaybeInvalidatePropertyCache(this,prop);
      return;
    }
    if (this->IsImportedTarget == true) {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_198);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_198,"SOURCES property can\'t be set on imported targets (\"",0x34)
      ;
      poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_198,(this->Name)._M_dataplus._M_p,
                          (this->Name)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\")\n",3);
      pcVar2 = this->Makefile;
      std::__cxx11::stringbuf::str();
      cmMakefile::IssueMessage(pcVar2,FATAL_ERROR,(string *)local_210);
      goto LAB_0030a503;
    }
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>_>_>
    ::clear(&(((this->Internal).Pointer)->SourceFilesMap)._M_t);
    cmMakefile::GetBacktrace((cmListFileBacktrace *)local_198,this->Makefile);
    cmGeneratorExpression::cmGeneratorExpression
              ((cmGeneratorExpression *)local_210,(cmListFileBacktrace *)local_198);
    cmGeneratorExpression::Parse(&local_218,local_210);
    local_1e0._M_dataplus._M_p = (pointer)local_218.Backtrace;
    local_218.Backtrace = (cmListFileBacktrace *)0x0;
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
              ((auto_ptr<cmCompiledGeneratorExpression> *)&local_218);
    pcVar4 = (this->Internal).Pointer;
    local_218.Backtrace = (cmListFileBacktrace *)operator_new(0x10);
    _Var6._M_p = local_1e0._M_dataplus._M_p;
    local_1e0._M_dataplus._M_p = (pointer)0x0;
    local_1c0.x_ = (cmCompiledGeneratorExpression *)0x0;
    (((cmCompiledGeneratorExpression *)local_218.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)_Var6._M_p;
    (((cmCompiledGeneratorExpression *)local_218.Backtrace)->Backtrace).
    super_vector<cmListFileContext,_std::allocator<cmListFileContext>_>.
    super__Vector_base<cmListFileContext,_std::allocator<cmListFileContext>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)&cmTargetInternals::TargetPropertyEntry::NoLinkImplItem;
    std::
    vector<cmTargetInternals::TargetPropertyEntry_*,_std::allocator<cmTargetInternals::TargetPropertyEntry_*>_>
    ::push_back(&pcVar4->SourceEntries,(value_type *)&local_218);
    cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr(&local_1c0);
    this_01 = (cmGeneratorExpression *)(local_200 + 0x20);
  }
  cmsys::auto_ptr<cmCompiledGeneratorExpression>::~auto_ptr
            ((auto_ptr<cmCompiledGeneratorExpression> *)this_01);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_210);
  this_02 = (vector<cmListFileContext,_std::allocator<cmListFileContext>_> *)local_198;
LAB_0030a8e6:
  std::vector<cmListFileContext,_std::allocator<cmListFileContext>_>::~vector(this_02);
  return;
}

Assistant:

void cmTarget::AppendProperty(const std::string& prop, const char* value,
                              bool asString)
{
  if (this->GetType() == INTERFACE_LIBRARY
      && !whiteListedInterfaceProperty(prop))
    {
    std::ostringstream e;
    e << "INTERFACE_LIBRARY targets may only have whitelisted properties.  "
         "The property \"" << prop << "\" is not allowed.";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if (prop == "NAME")
    {
    std::ostringstream e;
    e << "NAME property is read-only\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    return;
    }
  else if(prop == "INCLUDE_DIRECTORIES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->IncludeDirectoriesEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "COMPILE_OPTIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->CompileOptionsEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "COMPILE_FEATURES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->CompileFeaturesEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "COMPILE_DEFINITIONS")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmGeneratorExpression ge(&lfbt);
    this->Internal->CompileDefinitionsEntries.push_back(
              new cmTargetInternals::TargetPropertyEntry(ge.Parse(value)));
    }
  else if(prop == "EXPORT_NAME" && this->IsImported())
    {
    std::ostringstream e;
    e << "EXPORT_NAME property can't be set on imported targets (\""
          << this->Name << "\")\n";
    this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
    }
  else if (prop == "LINK_LIBRARIES")
    {
    cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
    cmValueWithOrigin entry(value, lfbt);
    this->Internal->LinkImplementationPropertyEntries.push_back(entry);
    }
  else if (prop == "SOURCES")
    {
    if(this->IsImported())
      {
      std::ostringstream e;
      e << "SOURCES property can't be set on imported targets (\""
            << this->Name << "\")\n";
      this->Makefile->IssueMessage(cmake::FATAL_ERROR, e.str());
      return;
      }
      this->Internal->SourceFilesMap.clear();
      cmListFileBacktrace lfbt = this->Makefile->GetBacktrace();
      cmGeneratorExpression ge(&lfbt);
      cmsys::auto_ptr<cmCompiledGeneratorExpression> cge = ge.Parse(value);
      this->Internal->SourceEntries.push_back(
                            new cmTargetInternals::TargetPropertyEntry(cge));
    }
  else
    {
    this->Properties.AppendProperty(prop, value, asString);
    this->MaybeInvalidatePropertyCache(prop);
    }
}